

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

mcpl_particle_t * mcpl_get_empty_particle(mcpl_outfile_t of)

{
  mcpl_particle_t *pmVar1;
  
  if (*(long *)((long)of.internal + 0x78) == 0) {
    pmVar1 = (mcpl_particle_t *)mcpl_internal_calloc(1,0x68);
    *(mcpl_particle_t **)((long)of.internal + 0x78) = pmVar1;
    return pmVar1;
  }
  mcpl_error("mcpl_get_empty_particle must not be called more than once per output file");
}

Assistant:

mcpl_particle_t* mcpl_get_empty_particle(mcpl_outfile_t of)
{
  MCPLIMP_OUTFILEDECODE;
  if (f->puser) {
    //Calling more than once. This could be innocent, or it could indicate
    //problems in multi-threaded user-code. Better disallow and give an error:
    mcpl_error("mcpl_get_empty_particle must not be"
               " called more than once per output file");
  } else {
    f->puser = (mcpl_particle_t*)mcpl_internal_calloc(1,sizeof(mcpl_particle_t));
  }
  return f->puser;
}